

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O3

void jsimd_rgb_gray_convert
               (j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
               JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  code *UNRECOVERED_JUMPTABLE;
  code *pcVar2;
  
  uVar1 = cinfo->in_color_space - JCS_EXT_RGB;
  if (uVar1 < 10) {
    UNRECOVERED_JUMPTABLE = (code *)(&PTR_jsimd_extrgb_gray_convert_avx2_001a6ab0)[uVar1];
    pcVar2 = (code *)(&PTR_jsimd_extrgb_gray_convert_sse2_001a6b00)[uVar1];
  }
  else {
    pcVar2 = jsimd_rgb_gray_convert_sse2;
    UNRECOVERED_JUMPTABLE = jsimd_rgb_gray_convert_avx2;
  }
  if (-1 < (char)simd_support) {
    UNRECOVERED_JUMPTABLE = pcVar2;
  }
  (*UNRECOVERED_JUMPTABLE)(cinfo->image_width);
  return;
}

Assistant:

GLOBAL(void)
jsimd_rgb_gray_convert(j_compress_ptr cinfo, JSAMPARRAY input_buf,
                       JSAMPIMAGE output_buf, JDIMENSION output_row,
                       int num_rows)
{
  void (*avx2fct) (JDIMENSION, JSAMPARRAY, JSAMPIMAGE, JDIMENSION, int);
  void (*sse2fct) (JDIMENSION, JSAMPARRAY, JSAMPIMAGE, JDIMENSION, int);

  switch (cinfo->in_color_space) {
  case JCS_EXT_RGB:
    avx2fct = jsimd_extrgb_gray_convert_avx2;
    sse2fct = jsimd_extrgb_gray_convert_sse2;
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    avx2fct = jsimd_extrgbx_gray_convert_avx2;
    sse2fct = jsimd_extrgbx_gray_convert_sse2;
    break;
  case JCS_EXT_BGR:
    avx2fct = jsimd_extbgr_gray_convert_avx2;
    sse2fct = jsimd_extbgr_gray_convert_sse2;
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    avx2fct = jsimd_extbgrx_gray_convert_avx2;
    sse2fct = jsimd_extbgrx_gray_convert_sse2;
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    avx2fct = jsimd_extxbgr_gray_convert_avx2;
    sse2fct = jsimd_extxbgr_gray_convert_sse2;
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    avx2fct = jsimd_extxrgb_gray_convert_avx2;
    sse2fct = jsimd_extxrgb_gray_convert_sse2;
    break;
  default:
    avx2fct = jsimd_rgb_gray_convert_avx2;
    sse2fct = jsimd_rgb_gray_convert_sse2;
    break;
  }

  if (simd_support & JSIMD_AVX2)
    avx2fct(cinfo->image_width, input_buf, output_buf, output_row, num_rows);
  else
    sse2fct(cinfo->image_width, input_buf, output_buf, output_row, num_rows);
}